

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 SyStrToInt32(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  sxi32 sVar1;
  char *pcVar2;
  ushort **ppuVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  short local_3e;
  int local_3c;
  sxi16 i;
  sxi32 nVal;
  char *zEnd;
  int isNeg;
  char **zRest_local;
  void *pOutVal_local;
  char *pcStack_10;
  sxu32 nLen_local;
  char *zSrc_local;
  
  bVar6 = false;
  local_3c = 0;
  pcVar2 = zSrc + nLen;
  pcStack_10 = zSrc;
  while( true ) {
    bVar5 = false;
    if (pcStack_10 < pcVar2) {
      ppuVar3 = __ctype_b_loc();
      bVar5 = ((*ppuVar3)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar5) break;
    pcStack_10 = pcStack_10 + 1;
  }
  if ((pcStack_10 < pcVar2) && ((*pcStack_10 == '-' || (*pcStack_10 == '+')))) {
    bVar6 = *pcStack_10 == '-';
    pcStack_10 = pcStack_10 + 1;
  }
  while( true ) {
    bVar5 = false;
    if (pcStack_10 < pcVar2) {
      bVar5 = *pcStack_10 == '0';
    }
    if (!bVar5) break;
    pcStack_10 = pcStack_10 + 1;
  }
  local_3e = 10;
  if (9 < (uint)((int)pcVar2 - (int)pcStack_10)) {
    pcVar4 = "2147483647";
    if (bVar6) {
      pcVar4 = "2147483648";
    }
    sVar1 = SyMemcmp(pcStack_10,pcVar4,nLen);
    local_3e = 9;
    if (sVar1 < 1) {
      local_3e = 10;
    }
  }
  while (((pcVar4 = pcStack_10, pcStack_10 < pcVar2 && (local_3e != 0)) &&
         (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*pcStack_10] & 0x800) != 0))) {
    local_3c = local_3c * 10 + *pcStack_10 + -0x30;
    pcVar4 = pcStack_10 + 1;
    if (((pcVar2 <= pcVar4) || (local_3e == 1)) ||
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*pcVar4] & 0x800) == 0)) break;
    local_3c = local_3c * 10 + *pcVar4 + -0x30;
    pcVar4 = pcStack_10 + 2;
    if (((pcVar2 <= pcVar4) || (local_3e == 2)) ||
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*pcVar4] & 0x800) == 0)) break;
    local_3c = local_3c * 10 + *pcVar4 + -0x30;
    pcVar4 = pcStack_10 + 3;
    if (((pcVar2 <= pcVar4) || (local_3e == 3)) ||
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*pcVar4] & 0x800) == 0)) break;
    local_3c = local_3c * 10 + *pcVar4 + -0x30;
    local_3e = local_3e + -4;
    pcStack_10 = pcStack_10 + 4;
  }
  while( true ) {
    pcStack_10 = pcVar4;
    bVar5 = false;
    if (pcStack_10 < pcVar2) {
      ppuVar3 = __ctype_b_loc();
      bVar5 = ((*ppuVar3)[(int)*pcStack_10] & 0x2000) != 0;
    }
    if (!bVar5) break;
    pcVar4 = pcStack_10 + 1;
  }
  if (zRest != (char **)0x0) {
    *zRest = pcStack_10;
  }
  if (pOutVal != (void *)0x0) {
    if ((bVar6) && (local_3c != 0)) {
      local_3c = -local_3c;
    }
    *(int *)pOutVal = local_3c;
  }
  sVar1 = -0xc;
  if (pcVar2 <= pcStack_10) {
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

JX9_PRIVATE sxi32 SyStrToInt32(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	int isNeg = FALSE;
	const char *zEnd;
	sxi32 nVal = 0;
	sxi16 i;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	i = 10;
	if( (sxu32)(zEnd-zSrc) >= 10 ){
		/* Handle overflow */
		i = SyMemcmp(zSrc, (isNeg == TRUE) ? SXINT32_MIN_STR : SXINT32_MAX_STR, nLen) <= 0 ? 10 : 9; 
	}
	for(;;){
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
		if(zSrc >= zEnd || !i || !SyisDigit(zSrc[0])){ break; } nVal = nVal * 10 + ( zSrc[0] - '0' ) ; --i ; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = (char *)zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi32 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}